

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,duckdb::MedianAbsoluteDeviationOperation<double>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  unsigned_long *puVar1;
  double *idata;
  QuantileState<double,_duckdb::QuantileStandardType> **states_00;
  vector<double,_std::allocator<double>_> *pvVar2;
  iterator iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat sdata;
  double local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (states->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_c0.data = (data_ptr_t)&input->validity;
      local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_c0.sel = (SelectionVector *)aggr_input_data;
      QuantileOperation::
      ConstantOperation<double,duckdb::QuantileState<double,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<double>>
                (*(QuantileState<double,_duckdb::QuantileStandardType> **)states->data,
                 (double *)input->data,(AggregateUnaryInput *)&local_c0,count);
    }
  }
  else {
    if (input->vector_type == FLAT_VECTOR && states->vector_type == FLAT_VECTOR) {
      idata = (double *)input->data;
      states_00 = (QuantileState<double,_duckdb::QuantileStandardType> **)states->data;
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::QuantileState<double,duckdb::QuantileStandardType>,double,duckdb::MedianAbsoluteDeviationOperation<double>>
                (idata,aggr_input_data,states_00,&input->validity,count);
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_c0);
    Vector::ToUnifiedFormat(states,count,&local_78);
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        uVar6 = 0;
        do {
          uVar4 = uVar6;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar4 = (ulong)(local_c0.sel)->sel_vector[uVar6];
          }
          uVar5 = uVar6;
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)(local_78.sel)->sel_vector[uVar6];
          }
          pvVar2 = *(vector<double,_std::allocator<double>_> **)(local_78.data + uVar5 * 8);
          local_c8 = *(double *)(local_c0.data + uVar4 * 8);
          iVar3._M_current =
               (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar2,iVar3,&local_c8);
          }
          else {
            *iVar3._M_current = local_c8;
            (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    else if (count != 0) {
      uVar6 = 0;
      do {
        uVar4 = uVar6;
        if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
          uVar4 = (ulong)(local_c0.sel)->sel_vector[uVar6];
        }
        uVar5 = uVar6;
        if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)(local_78.sel)->sel_vector[uVar6];
        }
        if ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6]
             >> (uVar4 & 0x3f) & 1) != 0)) {
          pvVar2 = *(vector<double,_std::allocator<double>_> **)(local_78.data + uVar5 * 8);
          local_c8 = *(double *)(local_c0.data + uVar4 * 8);
          iVar3._M_current =
               (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar2,iVar3,&local_c8);
          }
          else {
            *iVar3._M_current = local_c8;
            (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if (local_c0.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}